

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threaded_resampler.cpp
# Opt level: O0

void __thiscall
crnlib::threaded_resampler::resample_y_task(threaded_resampler *this,uint64 data,void *param_2)

{
  float low;
  float high;
  pixel_format pVar1;
  uint uVar2;
  uint uVar3;
  vec<4U,_float> *pvVar4;
  float *pfVar5;
  float fVar6;
  vec<4U,_float> *local_c8;
  vec4F *pDst_2;
  vec4F *pDst_1;
  float *pDst;
  float h;
  float l;
  vec4F *pSrc_end;
  uint local_8c;
  uint i_1;
  uint local_78;
  float local_74;
  uint i;
  float weight;
  vec4F *p;
  vec<4U,_float> *pvStack_60;
  uint src_y_iter;
  vec4F *pSrc;
  Contrib_List *contribs;
  uint local_3c;
  undefined1 local_38 [4];
  uint dst_y;
  vector<crnlib::vec<4U,_float>_> tmp;
  uint thread_index;
  void *param_2_local;
  uint64 data_local;
  threaded_resampler *this_local;
  
  tmp.m_capacity = (uint)data;
  vector<crnlib::vec<4U,_float>_>::vector
            ((vector<crnlib::vec<4U,_float>_> *)local_38,this->m_pParams->m_dst_width);
  for (local_3c = 0; local_3c < this->m_pParams->m_dst_height; local_3c = local_3c + 1) {
    uVar3 = task_pool::get_num_threads(this->m_pTask_pool);
    uVar2 = local_3c;
    if ((uVar3 == 0) ||
       (uVar3 = task_pool::get_num_threads(this->m_pTask_pool),
       uVar2 % (uVar3 + 1) == tmp.m_capacity)) {
      pSrc = (vec4F *)(this->m_pY_contribs + local_3c);
      if (((Contrib_List *)pSrc)->n == 1) {
        pvStack_60 = vector<crnlib::vec<4U,_float>_>::get_ptr(&this->m_tmp_img);
        pvStack_60 = pvStack_60 +
                     this->m_pParams->m_dst_width * (uint)*(ushort *)(*(long *)(pSrc->m_s + 2) + 4);
      }
      else {
        for (p._4_4_ = 0; p._4_4_ < *(ushort *)pSrc->m_s; p._4_4_ = p._4_4_ + 1) {
          _i = vector<crnlib::vec<4U,_float>_>::get_ptr(&this->m_tmp_img);
          _i = _i + this->m_pParams->m_dst_width *
                    (uint)*(ushort *)(*(long *)(pSrc->m_s + 2) + 4 + (ulong)p._4_4_ * 8);
          local_74 = *(float *)(*(long *)(pSrc->m_s + 2) + (ulong)p._4_4_ * 8);
          if (p._4_4_ == 0) {
            for (local_78 = 0; local_78 < this->m_pParams->m_dst_width; local_78 = local_78 + 1) {
              crnlib::operator*((crnlib *)&stack0xffffffffffffff78,_i + local_78,local_74);
              pvVar4 = vector<crnlib::vec<4U,_float>_>::operator[]
                                 ((vector<crnlib::vec<4U,_float>_> *)local_38,local_78);
              vec<4U,_float>::operator=(pvVar4,(vec<4U,_float> *)&stack0xffffffffffffff78);
            }
          }
          else {
            for (local_8c = 0; local_8c < this->m_pParams->m_dst_width; local_8c = local_8c + 1) {
              crnlib::operator*((crnlib *)((long)&pSrc_end + 4),_i + local_8c,local_74);
              pvVar4 = vector<crnlib::vec<4U,_float>_>::operator[]
                                 ((vector<crnlib::vec<4U,_float>_> *)local_38,local_8c);
              vec<4U,_float>::operator+=(pvVar4,(vec<4U,_float> *)((long)&pSrc_end + 4));
            }
          }
        }
        pvStack_60 = vector<crnlib::vec<4U,_float>_>::get_ptr
                               ((vector<crnlib::vec<4U,_float>_> *)local_38);
      }
      pvVar4 = pvStack_60 + this->m_pParams->m_dst_width;
      low = this->m_pParams->m_sample_low;
      high = this->m_pParams->m_sample_high;
      pVar1 = this->m_pParams->m_fmt;
      if (pVar1 == cPF_Y_F32) {
        pDst_1 = (vec4F *)((long)this->m_pParams->m_pDst_pixels +
                          (ulong)(this->m_pParams->m_dst_pitch * local_3c));
        do {
          fVar6 = vec<4U,_float>::operator[](pvStack_60,0);
          fVar6 = math::clamp<float>(fVar6,low,high);
          pDst_1->m_s[0] = fVar6;
          pvStack_60 = pvStack_60 + 1;
          pDst_1 = (vec4F *)(pDst_1->m_s + 1);
        } while (pvStack_60 != pvVar4);
      }
      else if (pVar1 == cPF_RGBX_F32) {
        pDst_2 = (vec4F *)((long)this->m_pParams->m_pDst_pixels +
                          (ulong)(this->m_pParams->m_dst_pitch * local_3c));
        do {
          fVar6 = vec<4U,_float>::operator[](pvStack_60,0);
          fVar6 = math::clamp<float>(fVar6,low,high);
          pfVar5 = vec<4U,_float>::operator[](pDst_2,0);
          *pfVar5 = fVar6;
          fVar6 = vec<4U,_float>::operator[](pvStack_60,1);
          fVar6 = math::clamp<float>(fVar6,low,high);
          pfVar5 = vec<4U,_float>::operator[](pDst_2,1);
          *pfVar5 = fVar6;
          fVar6 = vec<4U,_float>::operator[](pvStack_60,2);
          fVar6 = math::clamp<float>(fVar6,low,high);
          pfVar5 = vec<4U,_float>::operator[](pDst_2,2);
          *pfVar5 = fVar6;
          pfVar5 = vec<4U,_float>::operator[](pDst_2,3);
          *pfVar5 = high;
          pvStack_60 = pvStack_60 + 1;
          pDst_2 = pDst_2 + 1;
        } while (pvStack_60 != pvVar4);
      }
      else if (pVar1 == cPF_RGBA_F32) {
        local_c8 = (vec<4U,_float> *)
                   ((long)this->m_pParams->m_pDst_pixels +
                   (ulong)(this->m_pParams->m_dst_pitch * local_3c));
        do {
          fVar6 = vec<4U,_float>::operator[](pvStack_60,0);
          fVar6 = math::clamp<float>(fVar6,low,high);
          pfVar5 = vec<4U,_float>::operator[](local_c8,0);
          *pfVar5 = fVar6;
          fVar6 = vec<4U,_float>::operator[](pvStack_60,1);
          fVar6 = math::clamp<float>(fVar6,low,high);
          pfVar5 = vec<4U,_float>::operator[](local_c8,1);
          *pfVar5 = fVar6;
          fVar6 = vec<4U,_float>::operator[](pvStack_60,2);
          fVar6 = math::clamp<float>(fVar6,low,high);
          pfVar5 = vec<4U,_float>::operator[](local_c8,2);
          *pfVar5 = fVar6;
          fVar6 = vec<4U,_float>::operator[](pvStack_60,3);
          fVar6 = math::clamp<float>(fVar6,low,high);
          pfVar5 = vec<4U,_float>::operator[](local_c8,3);
          *pfVar5 = fVar6;
          pvStack_60 = pvStack_60 + 1;
          local_c8 = local_c8 + 1;
        } while (pvStack_60 != pvVar4);
      }
    }
  }
  vector<crnlib::vec<4U,_float>_>::~vector((vector<crnlib::vec<4U,_float>_> *)local_38);
  return;
}

Assistant:

void threaded_resampler::resample_y_task(uint64 data, void*)
    {
        const uint thread_index = (uint)data;

        crnlib::vector<vec4F> tmp(m_pParams->m_dst_width);

        for (uint dst_y = 0; dst_y < m_pParams->m_dst_height; dst_y++)
        {
            if (m_pTask_pool->get_num_threads())
            {
                if ((dst_y % (m_pTask_pool->get_num_threads() + 1)) != thread_index)
                {
                    continue;
                }
            }

            const Resampler::Contrib_List& contribs = m_pY_contribs[dst_y];

            const vec4F* pSrc;

            if (contribs.n == 1)
            {
                pSrc = m_tmp_img.get_ptr() + m_pParams->m_dst_width * contribs.p[0].pixel;
            }
            else
            {
                for (uint src_y_iter = 0; src_y_iter < contribs.n; src_y_iter++)
                {
                    const vec4F* p = m_tmp_img.get_ptr() + m_pParams->m_dst_width * contribs.p[src_y_iter].pixel;
                    const float weight = contribs.p[src_y_iter].weight;

                    if (!src_y_iter)
                    {
                        for (uint i = 0; i < m_pParams->m_dst_width; i++)
                        {
                            tmp[i] = p[i] * weight;
                        }
                    }
                    else
                    {
                        for (uint i = 0; i < m_pParams->m_dst_width; i++)
                        {
                            tmp[i] += p[i] * weight;
                        }
                    }
                }

                pSrc = tmp.get_ptr();
            }

            const vec4F* pSrc_end = pSrc + m_pParams->m_dst_width;

            const float l = m_pParams->m_sample_low;
            const float h = m_pParams->m_sample_high;

            switch (m_pParams->m_fmt)
            {
            case cPF_Y_F32:
            {
                float* pDst = reinterpret_cast<float*>(static_cast<uint8*>(m_pParams->m_pDst_pixels) + m_pParams->m_dst_pitch * dst_y);

                do
                {
                    *pDst++ = math::clamp((*pSrc)[0], l, h);

                    pSrc++;
                } while (pSrc != pSrc_end);

                break;
            }
            case cPF_RGBX_F32:
            {
                vec4F* pDst = reinterpret_cast<vec4F*>(static_cast<uint8*>(m_pParams->m_pDst_pixels) + m_pParams->m_dst_pitch * dst_y);

                do
                {
                    (*pDst)[0] = math::clamp((*pSrc)[0], l, h);
                    (*pDst)[1] = math::clamp((*pSrc)[1], l, h);
                    (*pDst)[2] = math::clamp((*pSrc)[2], l, h);
                    (*pDst)[3] = h;

                    pSrc++;
                    pDst++;
                } while (pSrc != pSrc_end);

                break;
            }
            case cPF_RGBA_F32:
            {
                vec4F* pDst = reinterpret_cast<vec4F*>(static_cast<uint8*>(m_pParams->m_pDst_pixels) + m_pParams->m_dst_pitch * dst_y);

                do
                {
                    (*pDst)[0] = math::clamp((*pSrc)[0], l, h);
                    (*pDst)[1] = math::clamp((*pSrc)[1], l, h);
                    (*pDst)[2] = math::clamp((*pSrc)[2], l, h);
                    (*pDst)[3] = math::clamp((*pSrc)[3], l, h);

                    pSrc++;
                    pDst++;
                } while (pSrc != pSrc_end);

                break;
            }
            default:
                break;
            }
        }
    }